

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall
TEST_PlayerHandTest_Sequence_TestShell::~TEST_PlayerHandTest_Sequence_TestShell
          (TEST_PlayerHandTest_Sequence_TestShell *this)

{
  TEST_PlayerHandTest_Sequence_TestShell *mem;
  TEST_PlayerHandTest_Sequence_TestShell *this_local;
  
  mem = this;
  ~TEST_PlayerHandTest_Sequence_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(PlayerHandTest, Sequence)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::TwoOfCircles);
	h.add(Tile::ThreeOfCircles);

	h.bindSequence({
		Tile::OneOfCircles,
		Tile::TwoOfCircles,
		Tile::ThreeOfCircles
	});

	CHECK(!h.isClosedHand());
}